

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cwd-and-chdir.c
# Opt level: O2

int run_test_cwd_and_chdir(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_820;
  size_t size1;
  size_t size2;
  char buffer_orig [1024];
  char buffer_new [1024];
  
  size1 = 1;
  iVar1 = uv_cwd(buffer_orig,&size1);
  if (iVar1 == -0x69) {
    if (size1 < 2) {
      pcVar2 = "size1 > 1";
      uStack_820 = 0x27;
    }
    else {
      size1 = 0x400;
      iVar1 = uv_cwd(buffer_orig,&size1);
      if (iVar1 == 0) {
        if (size1 == 0) {
          pcVar2 = "size1 > 0";
          uStack_820 = 0x2c;
        }
        else if (buffer_orig[size1] == '/') {
          pcVar2 = "buffer_orig[size1] != \'/\'";
          uStack_820 = 0x2d;
        }
        else {
          iVar1 = uv_chdir(buffer_orig);
          if (iVar1 == 0) {
            size2 = 0x400;
            iVar1 = uv_cwd(buffer_new,&size2);
            if (iVar1 == 0) {
              if (size1 == size2) {
                iVar1 = strcmp(buffer_orig,buffer_new);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar2 = "strcmp(buffer_orig, buffer_new) == 0";
                uStack_820 = 0x37;
              }
              else {
                pcVar2 = "size1 == size2";
                uStack_820 = 0x36;
              }
            }
            else {
              pcVar2 = "err == 0";
              uStack_820 = 0x34;
            }
          }
          else {
            pcVar2 = "err == 0";
            uStack_820 = 0x30;
          }
        }
      }
      else {
        pcVar2 = "err == 0";
        uStack_820 = 0x2b;
      }
    }
  }
  else {
    pcVar2 = "err == UV_ENOBUFS";
    uStack_820 = 0x26;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-cwd-and-chdir.c"
          ,uStack_820,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(cwd_and_chdir) {
  char buffer_orig[PATHMAX];
  char buffer_new[PATHMAX];
  size_t size1;
  size_t size2;
  int err;

  size1 = 1;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == UV_ENOBUFS);
  ASSERT(size1 > 1);

  size1 = sizeof buffer_orig;
  err = uv_cwd(buffer_orig, &size1);
  ASSERT(err == 0);
  ASSERT(size1 > 0);
  ASSERT(buffer_orig[size1] != '/');

  err = uv_chdir(buffer_orig);
  ASSERT(err == 0);

  size2 = sizeof buffer_new;
  err = uv_cwd(buffer_new, &size2);
  ASSERT(err == 0);

  ASSERT(size1 == size2);
  ASSERT(strcmp(buffer_orig, buffer_new) == 0);

  return 0;
}